

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

ctmbstr prvTidyGetEncodingOptNameFromTidyId(uint id)

{
  uint local_18;
  uint i;
  uint id_local;
  
  local_18 = 0;
  while( true ) {
    if (0xd < local_18) {
      return (ctmbstr)0x0;
    }
    if (enc2iana[local_18].id == id) break;
    local_18 = local_18 + 1;
  }
  return enc2iana[local_18].tidyOptName;
}

Assistant:

ctmbstr TY_(GetEncodingOptNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].tidyOptName;

    return NULL;
}